

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O2

bool anon_unknown.dwarf_642426::EqualDescriptor(string *a,string *b)

{
  char cVar1;
  ulong uVar2;
  __type_conflict _Var3;
  ulong uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = a->_M_string_length;
  if (uVar2 < 10) {
    uVar4 = b->_M_string_length;
    if (uVar4 < 10) goto LAB_003247ec;
    bVar5 = false;
LAB_0032476d:
    cVar1 = (b->_M_dataplus)._M_p[uVar4 - 9];
    bVar6 = cVar1 == '#';
    if (bVar5 == bVar6) goto LAB_003247ec;
    if (bVar5 != false) goto LAB_00324786;
    if (cVar1 != '#') goto LAB_003247ec;
  }
  else {
    cVar1 = (a->_M_dataplus)._M_p[uVar2 - 9];
    bVar5 = cVar1 == '#';
    uVar4 = b->_M_string_length;
    if (9 < uVar4) goto LAB_0032476d;
    if (cVar1 != '#') goto LAB_003247ec;
    bVar6 = false;
LAB_00324786:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,a,0,uVar2 - 9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (a,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar6) goto LAB_003247ec;
    uVar4 = b->_M_string_length;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_50,b,0,uVar4 - 9);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (b,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
LAB_003247ec:
  _Var3 = std::operator==(a,b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return _Var3;
  }
  __stack_chk_fail();
}

Assistant:

bool EqualDescriptor(std::string a, std::string b)
{
    bool a_check = (a.size() > 9 && a[a.size() - 9] == '#');
    bool b_check = (b.size() > 9 && b[b.size() - 9] == '#');
    if (a_check != b_check) {
        if (a_check) a = a.substr(0, a.size() - 9);
        if (b_check) b = b.substr(0, b.size() - 9);
    }
    return a == b;
}